

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  ImDrawList *this_00;
  ImWchar in_CX;
  ImDrawList *in_RDI;
  float in_XMM0_Da;
  float idx_count;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float scale;
  ImFontGlyph *glyph;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffffac;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 *in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc8;
  
  this_00 = (ImDrawList *)FindGlyph((ImFont *)in_RDI,in_CX);
  if ((this_00 != (ImDrawList *)0x0) && (((uint)(this_00->CmdBuffer).Size >> 1 & 1) != 0)) {
    if (in_XMM0_Da < 0.0) {
      idx_count = 1.0;
    }
    else {
      idx_count = in_XMM0_Da / (float)(in_RDI->IdxBuffer).Capacity;
    }
    ImDrawList::PrimReserve(in_RDI,(int)idx_count,in_stack_ffffffffffffff98);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,
                   *(float *)&(this_00->CmdBuffer).Data * idx_count + (float)(int)in_XMM1_Da,
                   *(float *)((long)&(this_00->CmdBuffer).Data + 4) * idx_count +
                   (float)(int)in_XMM1_Db);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,
                   (float)(this_00->IdxBuffer).Size * idx_count + (float)(int)in_XMM1_Da,
                   (float)(this_00->IdxBuffer).Capacity * idx_count + (float)(int)in_XMM1_Db);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,*(float *)&(this_00->IdxBuffer).Data,
                   *(float *)((long)&(this_00->IdxBuffer).Data + 4));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,(float)(this_00->VtxBuffer).Size,
                   (float)(this_00->VtxBuffer).Capacity);
    ImDrawList::PrimRectUV
              (this_00,(ImVec2 *)CONCAT44(idx_count,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (ImU32)in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}